

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturemanager.cpp
# Opt level: O3

void __thiscall FTextureManager::LoadTextureDefs(FTextureManager *this,int wadnum,char *lumpname)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined2 uVar4;
  TextureHash *pTVar5;
  undefined1 auVar6 [12];
  byte bVar7;
  int fitheight;
  bool bVar8;
  int iVar9;
  int iVar10;
  FTextureID picnum;
  FTexture *pFVar11;
  FTexture *this_00;
  byte bVar12;
  long lVar13;
  uint uVar14;
  BYTE BVar15;
  byte bVar16;
  uint uVar17;
  char *format;
  uint i;
  ulong uVar18;
  BYTE BVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  FString src;
  TArray<FTextureID,_FTextureID> tlist;
  int lastLump;
  FString base;
  FScanner sc;
  FString local_178;
  undefined4 local_16c;
  TArray<FTextureID,_FTextureID> local_168;
  int local_150;
  int local_14c;
  FString local_148;
  char *local_140;
  FString local_138;
  FScanner local_130;
  undefined3 uVar3;
  undefined1 auVar22 [16];
  
  local_178.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  local_168.Array = (FTextureID *)0x0;
  local_168.Most = 0;
  local_168.Count = 0;
  local_14c = 0;
  local_150 = wadnum;
  local_140 = lumpname;
LAB_00660157:
  do {
    lVar13 = 0;
    iVar9 = FWadCollection::FindLump(&Wads,lumpname,&local_14c,false);
    if (iVar9 == -1) {
      TArray<FTextureID,_FTextureID>::~TArray(&local_168);
      FString::~FString(&local_178);
      return;
    }
    iVar10 = FWadCollection::GetLumpFile(&Wads,iVar9);
  } while (iVar10 != wadnum);
  FScanner::FScanner(&local_130,iVar9);
LAB_00660194:
  do {
    bVar8 = FScanner::GetString(&local_130);
    if (!bVar8) break;
    bVar8 = FScanner::Compare(&local_130,"remap");
    if (bVar8) {
      FScanner::MustGetString(&local_130);
      bVar8 = FScanner::Compare(&local_130,"wall");
      local_16c = (undefined4)CONCAT71((int7)((ulong)lVar13 >> 8),1);
      if (bVar8) {
        BVar15 = '\x01';
LAB_0066041f:
        bVar12 = 0;
LAB_00660421:
        bVar7 = bVar12;
        BVar19 = BVar15;
        FScanner::MustGetString(&local_130);
        bVar16 = 0;
      }
      else {
        bVar8 = FScanner::Compare(&local_130,"flat");
        if (bVar8) {
          BVar15 = '\x02';
          goto LAB_0066041f;
        }
        bVar8 = FScanner::Compare(&local_130,"sprite");
        local_16c = 0;
        bVar16 = 1;
        BVar19 = '\0';
        bVar7 = 0;
        BVar15 = '\x03';
        bVar12 = 1;
        if (bVar8) goto LAB_00660421;
      }
      local_130.String[8] = '\0';
      if (local_168.Count != 0) {
        local_168._8_8_ = local_168._8_8_ & 0xffffffff;
      }
      ListTextures(this,local_130.String,&local_168);
      iVar9 = FName::NameManager::FindName(&FName::NameData,local_130.String,false);
      FScanner::MustGetString(&local_130);
      iVar10 = FWadCollection::CheckNumForFullName(&Wads,local_130.String,true,0xe);
      if (iVar10 == -1) {
        iVar10 = FWadCollection::CheckNumForFullName(&Wads,local_130.String,true,0xf);
      }
      format = "Attempting to remap non-existent texture %s to %s\n";
      if ((local_168.Count == 0) ||
         (format = "Attempting to remap texture %s to non-existent lump %s\n", iVar10 == -1)) {
        lVar13 = (long)iVar9 * 0x10;
        Printf(format,FName::NameData.NameArray[iVar9].Text,local_130.String);
      }
      else {
        uVar18 = 0;
        do {
          pTVar5 = (this->Textures).Array;
          pFVar11 = pTVar5[local_168.Array[uVar18].texnum].Texture;
          BVar15 = pFVar11->UseType;
          bVar12 = BVar15 == '\n' & (byte)local_16c | BVar19 == BVar15 | bVar16;
          lVar13 = CONCAT71((int7)((ulong)pTVar5 >> 8),bVar12);
          if (((bVar12 != 0) ||
              (((BVar15 == '\b' && !(bool)(bVar7 ^ 1) &&
                (iVar9 = (*pFVar11->_vptr_FTexture[6])(pFVar11), -1 < iVar9)) &&
               (iVar9 = FWadCollection::GetLumpNamespace(&Wads,iVar9), iVar9 == 1)))) &&
             (this_00 = FTexture::CreateTexture(iVar10,0), this_00 != (FTexture *)0x0)) {
            this_00->field_0x31 = this_00->field_0x31 | 4;
            uVar17 = (uint)((double)((uint)pFVar11->Width * 2) / (pFVar11->Scale).X);
            uVar14 = (uint)((double)((uint)pFVar11->Height * 2) / (pFVar11->Scale).Y);
            FTexture::SetScaledSize
                      (this_00,(uVar17 & 1) + ((int)uVar17 >> 1),(uVar14 & 1) + ((int)uVar14 >> 1));
            uVar20._0_2_ = pFVar11->LeftOffset;
            uVar20._2_2_ = pFVar11->TopOffset;
            uVar1 = pFVar11->WidthBits;
            uVar2 = pFVar11->HeightBits;
            uVar4 = *(undefined2 *)&pFVar11->field_0xe;
            uVar3 = CONCAT21(uVar4,uVar2);
            uVar20._4_4_ = CONCAT31(uVar3,uVar1);
            auVar22._8_4_ = 0;
            auVar22._0_8_ = uVar20;
            auVar22._12_2_ = uVar4;
            auVar22._14_2_ = uVar4;
            auVar21._12_4_ = auVar22._12_4_;
            auVar21._8_2_ = 0;
            auVar21._0_8_ = uVar20;
            auVar21._10_2_ = (short)uVar20._4_4_;
            auVar24._10_6_ = auVar21._10_6_;
            auVar24._8_2_ = (short)uVar20._4_4_;
            auVar24._0_8_ = uVar20;
            auVar6._4_8_ = auVar24._8_8_;
            auVar6._2_2_ = uVar20._2_2_;
            auVar6._0_2_ = uVar20._2_2_;
            auVar23._0_8_ = (double)((short)(undefined2)uVar20 * 2);
            auVar23._8_8_ = (double)((auVar6._0_4_ >> 0x10) * 2);
            auVar24 = divpd(auVar23,(undefined1  [16])pFVar11->Scale);
            uVar20 = CONCAT44((int)auVar24._8_8_,(int)auVar24._0_8_) & 0x100000001;
            auVar25._0_4_ =
                 (int)((this_00->Scale).X * (double)((int)uVar20 + ((int)auVar24._0_8_ >> 1)));
            auVar25._4_4_ =
                 (int)((this_00->Scale).Y *
                      (double)((int)(uVar20 >> 0x20) + ((int)auVar24._8_8_ >> 1)));
            auVar25._8_8_ = 0;
            auVar24 = pshuflw(auVar25,auVar25,0xe8);
            this_00->LeftOffset = (short)auVar24._0_4_;
            this_00->TopOffset = (short)((uint)auVar24._0_4_ >> 0x10);
            lVar13 = 0;
            ReplaceTexture(this,(FTextureID)local_168.Array[uVar18].texnum,this_00,true);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 < (ulong)local_168._8_8_ >> 0x20);
      }
      goto LAB_00660194;
    }
    bVar8 = FScanner::Compare(&local_130,"define");
    if (bVar8) {
      FScanner::GetString(&local_130);
      ExtractFileBase((char *)&local_148,SUB81(local_130.String,0));
      if (*(int *)(local_148.Chars + -0xc) != 0) {
        FString::Left(&local_138,(size_t)&local_148);
        FString::operator=(&local_178,&local_138);
        FString::~FString(&local_138);
        lVar13 = 0;
        iVar9 = FWadCollection::CheckNumForFullName(&Wads,local_130.String,true,0xe);
        if (iVar9 == -1) {
          lVar13 = 0;
          iVar9 = FWadCollection::CheckNumForFullName(&Wads,local_130.String,true,0xf);
        }
        FScanner::GetString(&local_130);
        bVar8 = FScanner::Compare(&local_130,"force32bit");
        if (!bVar8) {
          FScanner::UnGet(&local_130);
        }
        FScanner::GetNumber(&local_130);
        iVar10 = local_130.Number;
        FScanner::GetNumber(&local_130);
        fitheight = local_130.Number;
        if ((-1 < iVar9) &&
           (pFVar11 = FTexture::CreateTexture(iVar9,10), pFVar11 != (FTexture *)0x0)) {
          pFVar11->field_0x31 = pFVar11->field_0x31 | 4;
          FTexture::SetScaledSize(pFVar11,iVar10,fitheight);
          FString::operator=(&pFVar11->Name,&local_178);
          lVar13 = 0;
          picnum = CheckForTexture(&TexMan,local_178.Chars,8,1);
          if (picnum.texnum < 1) {
            AddTexture(this,pFVar11);
          }
          else {
            lVar13 = 0;
            ReplaceTexture(this,picnum,pFVar11,true);
            pFVar11->UseType = '\n';
          }
        }
      }
      FString::~FString(&local_148);
      goto LAB_00660194;
    }
    bVar8 = FScanner::Compare(&local_130,"texture");
    iVar9 = 10;
    if (!bVar8) {
      bVar8 = FScanner::Compare(&local_130,"sprite");
      iVar9 = 3;
      if (!bVar8) {
        bVar8 = FScanner::Compare(&local_130,"walltexture");
        iVar9 = 1;
        if (!bVar8) {
          bVar8 = FScanner::Compare(&local_130,"flat");
          iVar9 = 2;
          if (!bVar8) {
            bVar8 = FScanner::Compare(&local_130,"graphic");
            iVar9 = 8;
            if (!bVar8) {
              FScanner::ScriptError
                        (&local_130,"Texture definition expected, found \'%s\'",local_130.String);
              goto LAB_00660194;
            }
          }
        }
      }
    }
    ParseXTexture(this,&local_130,iVar9);
  } while( true );
  FScanner::~FScanner(&local_130);
  lumpname = local_140;
  wadnum = local_150;
  goto LAB_00660157;
}

Assistant:

void FTextureManager::LoadTextureDefs(int wadnum, const char *lumpname)
{
	int remapLump, lastLump;
	FString src;
	bool is32bit;
	int width, height;
	int type, mode;
	TArray<FTextureID> tlist;

	lastLump = 0;

	while ((remapLump = Wads.FindLump(lumpname, &lastLump)) != -1)
	{
		if (Wads.GetLumpFile(remapLump) == wadnum)
		{
			FScanner sc(remapLump);
			while (sc.GetString())
			{
				if (sc.Compare("remap")) // remap an existing texture
				{
					sc.MustGetString();

					// allow selection by type
					if (sc.Compare("wall")) type=FTexture::TEX_Wall, mode=FTextureManager::TEXMAN_Overridable;
					else if (sc.Compare("flat")) type=FTexture::TEX_Flat, mode=FTextureManager::TEXMAN_Overridable;
					else if (sc.Compare("sprite")) type=FTexture::TEX_Sprite, mode=0;
					else type = FTexture::TEX_Any, mode = 0;

					if (type != FTexture::TEX_Any) sc.MustGetString();

					sc.String[8]=0;

					tlist.Clear();
					int amount = ListTextures(sc.String, tlist);
					FName texname = sc.String;

					sc.MustGetString();
					int lumpnum = Wads.CheckNumForFullName(sc.String, true, ns_patches);
					if (lumpnum == -1) lumpnum = Wads.CheckNumForFullName(sc.String, true, ns_graphics);

					if (tlist.Size() == 0)
					{
						Printf("Attempting to remap non-existent texture %s to %s\n",
							texname.GetChars(), sc.String);
					}
					else if (lumpnum == -1)
					{
						Printf("Attempting to remap texture %s to non-existent lump %s\n",
							texname.GetChars(), sc.String);
					}
					else
					{
						for(unsigned int i = 0; i < tlist.Size(); i++)
						{
							FTexture * oldtex = Textures[tlist[i].GetIndex()].Texture;
							int sl;

							// only replace matching types. For sprites also replace any MiscPatches
							// based on the same lump. These can be created for icons.
							if (oldtex->UseType == type || type == FTexture::TEX_Any ||
								(mode == TEXMAN_Overridable && oldtex->UseType == FTexture::TEX_Override) ||
								(type == FTexture::TEX_Sprite && oldtex->UseType == FTexture::TEX_MiscPatch &&
								(sl=oldtex->GetSourceLump()) >= 0 && Wads.GetLumpNamespace(sl) == ns_sprites)
								)
							{
								FTexture * newtex = FTexture::CreateTexture (lumpnum, FTexture::TEX_Any);
								if (newtex != NULL)
								{
									// Replace the entire texture and adjust the scaling and offset factors.
									newtex->bWorldPanning = true;
									newtex->SetScaledSize(oldtex->GetScaledWidth(), oldtex->GetScaledHeight());
									newtex->LeftOffset = int(oldtex->GetScaledLeftOffset() * newtex->Scale.X);
									newtex->TopOffset = int(oldtex->GetScaledTopOffset() * newtex->Scale.Y);
									ReplaceTexture(tlist[i], newtex, true);
								}
							}
						}
					}
				}
				else if (sc.Compare("define")) // define a new "fake" texture
				{
					sc.GetString();
					
					FString base = ExtractFileBase(sc.String, false);
					if (!base.IsEmpty())
					{
						src = base.Left(8);

						int lumpnum = Wads.CheckNumForFullName(sc.String, true, ns_patches);
						if (lumpnum == -1) lumpnum = Wads.CheckNumForFullName(sc.String, true, ns_graphics);

						sc.GetString();
						is32bit = !!sc.Compare("force32bit");
						if (!is32bit) sc.UnGet();

						sc.GetNumber();
						width = sc.Number;
						sc.GetNumber();
						height = sc.Number;

						if (lumpnum>=0)
						{
							FTexture *newtex = FTexture::CreateTexture(lumpnum, FTexture::TEX_Override);

							if (newtex != NULL)
							{
								// Replace the entire texture and adjust the scaling and offset factors.
								newtex->bWorldPanning = true;
								newtex->SetScaledSize(width, height);
								newtex->Name = src;

								FTextureID oldtex = TexMan.CheckForTexture(src, FTexture::TEX_MiscPatch);
								if (oldtex.isValid()) 
								{
									ReplaceTexture(oldtex, newtex, true);
									newtex->UseType = FTexture::TEX_Override;
								}
								else AddTexture(newtex);
							}
						}
					}				
					//else Printf("Unable to define hires texture '%s'\n", tex->Name);
				}
				else if (sc.Compare("texture"))
				{
					ParseXTexture(sc, FTexture::TEX_Override);
				}
				else if (sc.Compare("sprite"))
				{
					ParseXTexture(sc, FTexture::TEX_Sprite);
				}
				else if (sc.Compare("walltexture"))
				{
					ParseXTexture(sc, FTexture::TEX_Wall);
				}
				else if (sc.Compare("flat"))
				{
					ParseXTexture(sc, FTexture::TEX_Flat);
				}
				else if (sc.Compare("graphic"))
				{
					ParseXTexture(sc, FTexture::TEX_MiscPatch);
				}
				else
				{
					sc.ScriptError("Texture definition expected, found '%s'", sc.String);
				}
			}
		}
	}
}